

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_explain.hpp
# Opt level: O2

void __thiscall
duckdb::LogicalExplain::LogicalExplain(LogicalExplain *this,ExplainType explain_type)

{
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_EXPLAIN);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalExplain_027a5f10;
  (this->super_LogicalOperator).field_0x61 = explain_type;
  (this->physical_plan)._M_dataplus._M_p = (pointer)&(this->physical_plan).field_2;
  (this->physical_plan)._M_string_length = 0;
  (this->physical_plan).field_2._M_local_buf[0] = '\0';
  (this->logical_plan_unopt)._M_dataplus._M_p = (pointer)&(this->logical_plan_unopt).field_2;
  (this->logical_plan_unopt)._M_string_length = 0;
  (this->logical_plan_unopt).field_2._M_local_buf[0] = '\0';
  (this->logical_plan_opt)._M_dataplus._M_p = (pointer)&(this->logical_plan_opt).field_2;
  (this->logical_plan_opt)._M_string_length = 0;
  (this->logical_plan_opt).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit LogicalExplain(ExplainType explain_type)
	    : LogicalOperator(LogicalOperatorType::LOGICAL_EXPLAIN), explain_type(explain_type) {}